

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_strings.c
# Opt level: O0

void cubeb_strings_destroy(cubeb_strings *strings)

{
  long *plVar1;
  void *in_RDI;
  char **se;
  char **sp;
  long *local_10;
  
  if (in_RDI != (void *)0x0) {
    local_10 = *(long **)((long)in_RDI + 8);
    plVar1 = local_10 + *(uint *)((long)in_RDI + 4);
    for (; local_10 != plVar1; local_10 = local_10 + 1) {
      if (*local_10 != 0) {
        free((void *)*local_10);
      }
    }
    if (*(long *)((long)in_RDI + 8) != (long)in_RDI + 0x10) {
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void
cubeb_strings_destroy(cubeb_strings * strings)
{
  char ** sp = NULL;
  char ** se = NULL;

  if (!strings) {
    return;
  }

  sp = strings->data;
  se = sp + strings->count;

  for (; sp != se; sp++) {
    if (*sp) {
      free(*sp);
    }
  }

  if (strings->data != strings->small_store) {
    free(strings->data);
  }

  free(strings);
}